

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_byte.hpp
# Opt level: O0

ans_byte_encode * ans_byte_encode::create(uint8_t *in_u8,size_t n)

{
  uint16_t uVar1;
  int iVar2;
  reference pvVar3;
  iterator __first;
  iterator __last;
  reference pvVar4;
  reference pvVar5;
  uint64_t uVar6;
  ulong in_RDX;
  ans_byte_encode *in_RDI;
  size_t sym;
  uint64_t tmp;
  uint64_t cur_base;
  size_t i;
  array<unsigned_long,_256UL> freqs;
  size_type in_stack_fffffffffffff598;
  undefined4 in_stack_fffffffffffff5a0;
  value_type_conflict5 in_stack_fffffffffffff5a4;
  uint16_t in_stack_fffffffffffff5a6;
  ans_byte_encode *in_stack_fffffffffffff5b0;
  ulong local_a30;
  undefined1 local_a18 [88];
  array<unsigned_long,_256UL> *in_stack_fffffffffffff640;
  ulong local_818;
  undefined1 local_810 [2048];
  ulong local_10;
  
  local_10 = in_RDX;
  ans_byte_encode(in_stack_fffffffffffff5b0);
  memset(local_810,0,0x800);
  for (local_818 = 0; local_818 < local_10; local_818 = local_818 + 1) {
    pvVar3 = std::array<unsigned_long,_256UL>::operator[]
                       ((array<unsigned_long,_256UL> *)
                        CONCAT26(in_stack_fffffffffffff5a6,
                                 CONCAT24(in_stack_fffffffffffff5a4,in_stack_fffffffffffff5a0)),
                        in_stack_fffffffffffff598);
    *pvVar3 = *pvVar3 + 1;
  }
  adjust_freqs(in_stack_fffffffffffff640);
  memcpy(in_RDI,local_a18,0x200);
  __first = std::begin<std::array<unsigned_short,256ul>>((array<unsigned_short,_256UL> *)0x189e4e);
  __last = std::end<std::array<unsigned_short,256ul>>((array<unsigned_short,_256UL> *)0x189e5d);
  iVar2 = std::accumulate<unsigned_short*,int>(__first,__last,0);
  in_RDI->frame_size = (long)iVar2;
  uVar1 = 0;
  for (local_a30 = 0; local_a30 < 0x100; local_a30 = local_a30 + 1) {
    pvVar4 = std::array<unsigned_short,_256UL>::operator[]
                       ((array<unsigned_short,_256UL> *)
                        CONCAT26(in_stack_fffffffffffff5a6,
                                 CONCAT24(in_stack_fffffffffffff5a4,in_stack_fffffffffffff5a0)),
                        in_stack_fffffffffffff598);
    in_stack_fffffffffffff5a4 = *pvVar4;
    pvVar5 = std::array<enc_entry,_256UL>::operator[]
                       ((array<enc_entry,_256UL> *)
                        CONCAT26(in_stack_fffffffffffff5a6,
                                 CONCAT24(in_stack_fffffffffffff5a4,in_stack_fffffffffffff5a0)),
                        in_stack_fffffffffffff598);
    pvVar5->freq = in_stack_fffffffffffff5a4;
    in_stack_fffffffffffff5a6 = uVar1;
    pvVar5 = std::array<enc_entry,_256UL>::operator[]
                       ((array<enc_entry,_256UL> *)
                        CONCAT26(uVar1,CONCAT24(in_stack_fffffffffffff5a4,in_stack_fffffffffffff5a0)
                                ),in_stack_fffffffffffff598);
    pvVar5->base = in_stack_fffffffffffff5a6;
    pvVar4 = std::array<unsigned_short,_256UL>::operator[]
                       ((array<unsigned_short,_256UL> *)
                        CONCAT26(in_stack_fffffffffffff5a6,
                                 CONCAT24(in_stack_fffffffffffff5a4,in_stack_fffffffffffff5a0)),
                        in_stack_fffffffffffff598);
    uVar6 = (ulong)*pvVar4 * 0x1000000000;
    pvVar5 = std::array<enc_entry,_256UL>::operator[]
                       ((array<enc_entry,_256UL> *)
                        CONCAT26(in_stack_fffffffffffff5a6,
                                 CONCAT24(in_stack_fffffffffffff5a4,in_stack_fffffffffffff5a0)),
                        in_stack_fffffffffffff598);
    pvVar5->sym_upper_bound = uVar6;
    pvVar4 = std::array<unsigned_short,_256UL>::operator[]
                       ((array<unsigned_short,_256UL> *)
                        CONCAT26(in_stack_fffffffffffff5a6,
                                 CONCAT24(in_stack_fffffffffffff5a4,in_stack_fffffffffffff5a0)),
                        in_stack_fffffffffffff598);
    uVar1 = *pvVar4 + uVar1;
  }
  in_RDI->lower_bound = in_RDI->frame_size << 4;
  return in_RDI;
}

Assistant:

static ans_byte_encode create(const uint8_t* in_u8, size_t n)
    {
        ans_byte_encode model;
        std::array<uint64_t, constants::MAX_SIGMA> freqs { 0 };
        for (size_t i = 0; i < n; i++) {
            freqs[in_u8[i]]++;
        }
        model.nfreqs = adjust_freqs(freqs);
        model.frame_size = std::accumulate(
            std::begin(model.nfreqs), std::end(model.nfreqs), 0);
        uint64_t cur_base = 0;
        uint64_t tmp = constants::K * constants::RADIX;
        for (size_t sym = 0; sym < constants::MAX_SIGMA; sym++) {
            model.table[sym].freq = model.nfreqs[sym];
            model.table[sym].base = cur_base;
            model.table[sym].sym_upper_bound = tmp * model.nfreqs[sym];
            cur_base += model.nfreqs[sym];
        }
        model.lower_bound = constants::K * model.frame_size;
        return model;
    }